

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  TimeUnitsDeclarationSyntax *pTVar2;
  Token TVar3;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  DividerClauseSyntax *in_stack_ffffffffffffffa0;
  Token *args_4;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  TVar3 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  args_4 = (Token *)TVar3.info;
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  lVar1._0_2_ = ((Token *)((long)__fn + 0x70))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x70))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x70))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x70))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::DividerClauseSyntax>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  pTVar2 = BumpAllocator::
           emplace<slang::syntax::TimeUnitsDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::DividerClauseSyntax*,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (DividerClauseSyntax **)__child_stack,args_4);
  return (int)pTVar2;
}

Assistant:

static SyntaxNode* clone(const TimeUnitsDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TimeUnitsDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.time.deepClone(alloc),
        node.divider ? deepClone(*node.divider, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}